

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

bool IsOperaSoftTrack(Track *track)

{
  pointer pSVar1;
  int iVar2;
  Sector *s;
  pointer pSVar3;
  uint uVar4;
  uint8_t *puVar5;
  
  iVar2 = Track::size(track);
  if (iVar2 == 9) {
    pSVar3 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = 0;
    if (pSVar3 != pSVar1) {
      puVar5 = "\x01\x01\x01\x01\x01\x01\x01\x01\b";
      do {
        if (pSVar3->datarate != _250K) {
          return false;
        }
        if (pSVar3->encoding != MFM) {
          return false;
        }
        if ((pSVar3->header).size != (uint)*puVar5) {
          return false;
        }
        uVar4 = uVar4 | 1 << ((byte)(pSVar3->header).sector & 0x1f);
        pSVar3 = pSVar3 + 1;
        puVar5 = puVar5 + 1;
      } while (pSVar3 != pSVar1);
      if (uVar4 == 0x1ff) {
        if (opt.debug != 0) {
          util::operator<<((LogHelper *)&util::cout,
                           (char (*) [42])"detected OperaSoft track with 32K sector\n");
          return true;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsOperaSoftTrack(const Track& track)
{
    uint32_t sector_mask = 0;
    int i = 0;

    if (track.size() != 9)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM)
            return false;

        static const uint8_t sizes[] = { 1,1,1,1,1,1,1,1,8 };
        if (s.header.size != sizes[i++])
            return false;

        sector_mask |= (1 << s.header.sector);
    }

    // Sectors must be numbered 0 to 8
    if (sector_mask != ((1 << 9) - 1))
        return false;

    if (opt.debug) util::cout << "detected OperaSoft track with 32K sector\n";
    return true;
}